

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecache.c
# Opt level: O3

h2o_filecache_ref_t * h2o_filecache_open_file(h2o_filecache_t *cache,char *path,int oflag)

{
  h2o_linklist_t *phVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  khint32_t *pkVar4;
  st_h2o_linklist_t *psVar5;
  kh_cstr_t pcVar6;
  long lVar7;
  long *plVar8;
  st_h2o_linklist_t *psVar9;
  ulong uVar10;
  char cVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  size_t sVar15;
  h2o_filecache_ref_t *ref;
  size_t sVar16;
  char *pcVar17;
  int *piVar18;
  byte bVar19;
  sbyte sVar20;
  char *pcVar21;
  uint uVar22;
  khint_t kVar23;
  kh_opencache_set_t *h;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  bool bVar29;
  
  h = cache->hash;
  kVar23 = h->n_buckets;
  if (kVar23 == 0) {
    uVar27 = 0;
LAB_001285ea:
    if (uVar27 == kVar23) goto LAB_001285f3;
    pcVar6 = h->keys[uVar27];
    plVar8 = (long *)(pcVar6 + -0x128);
    *plVar8 = *plVar8 + 1;
    ref = (h2o_filecache_ref_t *)(pcVar6 + -0x130);
  }
  else {
    uVar25 = (uint)*path;
    if (*path == '\0') {
      uVar25 = 0;
    }
    else {
      cVar11 = path[1];
      if (cVar11 != '\0') {
        pcVar21 = path + 2;
        do {
          uVar25 = (int)cVar11 + uVar25 * 0x1f;
          cVar11 = *pcVar21;
          pcVar21 = pcVar21 + 1;
        } while (cVar11 != '\0');
      }
    }
    uVar25 = uVar25 & kVar23 - 1;
    pkVar4 = h->flags;
    iVar24 = 1;
    uVar27 = uVar25;
    do {
      uVar28 = pkVar4[uVar27 >> 4];
      bVar19 = (char)uVar27 * '\x02' & 0x1e;
      uVar12 = uVar28 >> bVar19;
      if (((uVar12 & 2) != 0) ||
         (((uVar12 & 1) == 0 && (iVar13 = strcmp(h->keys[uVar27],path), iVar13 == 0)))) {
        if ((uVar28 >> bVar19 & 3) != 0) {
          uVar27 = kVar23;
        }
        goto LAB_001285ea;
      }
      uVar27 = uVar27 + iVar24 & kVar23 - 1;
      iVar24 = iVar24 + 1;
    } while (uVar27 != uVar25);
LAB_001285f3:
    sVar15 = strlen(path);
    ref = (h2o_filecache_ref_t *)malloc(sVar15 + 0x131);
    if (ref == (h2o_filecache_ref_t *)0x0) {
      h2o__fatal(
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/memory.h:330:no memory"
                );
    }
    ref->_refcnt = 1;
    pcVar21 = ref->_path;
    (ref->_lru).next = (st_h2o_linklist_t *)0x0;
    (ref->_lru).prev = (st_h2o_linklist_t *)0x0;
    strcpy(pcVar21,path);
    if (cache->capacity != 0) {
      sVar16 = 2;
      if (cache->capacity == (ulong)h->size) {
        if (kVar23 != 0) {
          psVar5 = (cache->lru).prev;
          cVar11 = *(char *)&psVar5[0x12].next;
          uVar27 = (uint)cVar11;
          if (cVar11 == '\0') {
            uVar27 = 0;
          }
          else {
            cVar11 = *(char *)((long)&psVar5[0x12].next + 1);
            if (cVar11 != '\0') {
              pcVar17 = (char *)((long)&psVar5[0x12].next + 2);
              do {
                uVar27 = (int)cVar11 + uVar27 * 0x1f;
                cVar11 = *pcVar17;
                pcVar17 = pcVar17 + 1;
              } while (cVar11 != '\0');
            }
          }
          uVar27 = uVar27 & kVar23 - 1;
          pkVar4 = h->flags;
          iVar24 = 1;
          uVar25 = uVar27;
          do {
            uVar28 = pkVar4[uVar25 >> 4];
            bVar19 = (char)uVar25 * '\x02' & 0x1e;
            uVar12 = uVar28 >> bVar19;
            if (((uVar12 & 2) != 0) ||
               (((uVar12 & 1) == 0 &&
                (iVar13 = strcmp(h->keys[uVar25],(char *)(psVar5 + 0x12)), iVar13 == 0)))) {
              if ((uVar28 >> bVar19 & 3) != 0) {
                uVar25 = kVar23;
              }
              goto LAB_00128777;
            }
            uVar25 = uVar25 + iVar24 & kVar23 - 1;
            iVar24 = iVar24 + 1;
          } while (uVar25 != uVar27);
LAB_00128746:
          __assert_fail("purge_iter != kh_end(cache->hash)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/common/filecache.c"
                        ,0x6c,
                        "h2o_filecache_ref_t *h2o_filecache_open_file(h2o_filecache_t *, const char *, int)"
                       );
        }
        uVar25 = 0;
LAB_00128777:
        if (uVar25 == kVar23) goto LAB_00128746;
        pcVar6 = h->keys[uVar25];
        uVar27 = h->flags[uVar25 >> 4];
        uVar28 = uVar25 * 2 & 0x1e;
        if ((uVar27 >> (sbyte)uVar28 & 3) == 0) {
          h->flags[uVar25 >> 4] = uVar27 | 1 << uVar28;
          h->size = h->size - 1;
        }
        lVar7 = *(long *)(pcVar6 + -0x120);
        plVar8 = *(long **)(pcVar6 + -0x118);
        *(long **)(lVar7 + 8) = plVar8;
        *plVar8 = lVar7;
        *(undefined1 (*) [16])(pcVar6 + -0x120) = (undefined1  [16])0x0;
        h2o_filecache_close_file((h2o_filecache_ref_t *)(pcVar6 + -0x130));
        h = cache->hash;
        sVar16 = ref->_refcnt + 1;
      }
      phVar1 = &ref->_lru;
      ref->_refcnt = sVar16;
      if (h->n_occupied < h->upper_bound) {
LAB_00128837:
        uVar27 = h->n_buckets;
        uVar26 = (ulong)uVar27;
        uVar25 = (uint)*pcVar21;
        if (*pcVar21 == '\0') {
          uVar25 = 0;
        }
        else {
          cVar11 = ref->field_0x131;
          if (cVar11 != '\0') {
            pcVar17 = &ref->field_0x132;
            do {
              uVar25 = (int)cVar11 + uVar25 * 0x1f;
              cVar11 = *pcVar17;
              pcVar17 = pcVar17 + 1;
            } while (cVar11 != '\0');
          }
        }
        uVar25 = uVar25 & uVar27 - 1;
        pkVar4 = h->flags;
        if ((pkVar4[uVar25 >> 4] >> ((char)uVar25 * '\x02' & 0x1fU) & 2) == 0) {
          iVar24 = 1;
          uVar28 = uVar25;
          do {
            uVar12 = pkVar4[uVar28 >> 4];
            uVar22 = uVar28 * 2 & 0x1e;
            sVar20 = (sbyte)uVar22;
            uVar14 = uVar12 >> sVar20;
            if (((uVar14 & 2) != 0) ||
               (((uVar14 & 1) == 0 && (iVar13 = strcmp(h->keys[uVar28],pcVar21), iVar13 == 0)))) {
              bVar29 = (uVar12 >> sVar20 & 2) == 0;
              uVar25 = (uint)uVar26;
              goto LAB_00128963;
            }
            if ((uVar12 >> uVar22 & 1) != 0) {
              uVar26 = (ulong)uVar28;
            }
            uVar28 = uVar28 + iVar24 & uVar27 - 1;
            iVar24 = iVar24 + 1;
          } while (uVar28 != uVar25);
          bVar29 = true;
          uVar28 = uVar25;
          uVar25 = uVar27;
          if ((uint)uVar26 == uVar27) {
LAB_00128963:
            if (uVar25 == uVar27) {
              uVar25 = uVar28;
            }
            if (bVar29) {
              uVar25 = uVar28;
            }
            uVar26 = (ulong)uVar25;
          }
        }
        else {
          uVar26 = (ulong)uVar25;
        }
        uVar10 = uVar26 >> 4;
        bVar19 = (char)uVar26 * '\x02' & 0x1e;
        if ((pkVar4[uVar10] >> bVar19 & 2) == 0) {
          if ((pkVar4[uVar10] >> bVar19 & 1) != 0) {
            h->keys[uVar26] = pcVar21;
            h->flags[uVar10] = h->flags[uVar10] & ~(3 << bVar19);
            h->size = h->size + 1;
          }
        }
        else {
          h->keys[uVar26] = pcVar21;
          h->flags[uVar10] = h->flags[uVar10] & ~(3 << bVar19);
          uVar2 = h->size;
          uVar3 = h->n_occupied;
          h->size = uVar2 + 1;
          h->n_occupied = uVar3 + 1;
        }
      }
      else {
        uVar27 = h->n_buckets;
        if (h->size * 2 < uVar27) {
          kVar23 = uVar27 - 1;
        }
        else {
          kVar23 = uVar27 + 1;
        }
        iVar24 = kh_resize_opencache_set(h,kVar23);
        if (-1 < iVar24) goto LAB_00128837;
      }
      if (phVar1->next != (st_h2o_linklist_t *)0x0) {
        __assert_fail("!h2o_linklist_is_linked(node)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/linklist.h"
                      ,0x59,"void h2o_linklist_insert(h2o_linklist_t *, h2o_linklist_t *)");
      }
      psVar5 = (cache->lru).next;
      psVar9 = psVar5->prev;
      (ref->_lru).prev = psVar9;
      (ref->_lru).next = psVar5;
      psVar9->next = phVar1;
      ((ref->_lru).next)->prev = phVar1;
    }
    iVar24 = open(path,oflag);
    ref->fd = iVar24;
    if (iVar24 == -1) {
      iVar24 = -1;
    }
    else {
      iVar24 = fstat(iVar24,(stat *)&(ref->field_3).field_0);
      if (iVar24 == 0) {
        *(undefined1 *)((long)&ref->field_3 + 200) = 0;
        *(undefined8 *)((long)&ref->field_3 + 0x108) = 0;
        goto LAB_00128a7d;
      }
      iVar24 = ref->fd;
    }
    piVar18 = __errno_location();
    (ref->field_3).open_err = *piVar18;
    if (iVar24 != -1) {
      close(iVar24);
      ref->fd = -1;
      goto LAB_00128a8c;
    }
  }
LAB_00128a7d:
  if (ref->fd != -1) {
    return ref;
  }
  piVar18 = __errno_location();
LAB_00128a8c:
  *piVar18 = (ref->field_3).open_err;
  h2o_filecache_close_file(ref);
  return (h2o_filecache_ref_t *)0x0;
}

Assistant:

h2o_filecache_ref_t *h2o_filecache_open_file(h2o_filecache_t *cache, const char *path, int oflag)
{
    khiter_t iter = kh_get(opencache_set, cache->hash, path);
    h2o_filecache_ref_t *ref;
    int dummy;

    /* lookup cache, and return the one if found */
    if (iter != kh_end(cache->hash)) {
        ref = H2O_STRUCT_FROM_MEMBER(h2o_filecache_ref_t, _path, kh_key(cache->hash, iter));
        ++ref->_refcnt;
        goto Exit;
    }

    /* create a new cache entry */
    ref = h2o_mem_alloc(offsetof(h2o_filecache_ref_t, _path) + strlen(path) + 1);
    ref->_refcnt = 1;
    ref->_lru = (h2o_linklist_t){NULL};
    strcpy(ref->_path, path);

    /* if cache is used, then... */
    if (cache->capacity != 0) {
        /* purge one entry from LRU if cache is full */
        if (kh_size(cache->hash) == cache->capacity) {
            h2o_filecache_ref_t *purge_ref = H2O_STRUCT_FROM_MEMBER(h2o_filecache_ref_t, _lru, cache->lru.prev);
            khiter_t purge_iter = kh_get(opencache_set, cache->hash, purge_ref->_path);
            assert(purge_iter != kh_end(cache->hash));
            release_from_cache(cache, purge_iter);
        }
        /* assign the new entry */
        ++ref->_refcnt;
        kh_put(opencache_set, cache->hash, ref->_path, &dummy);
        h2o_linklist_insert(cache->lru.next, &ref->_lru);
    }

    /* open the file, or memoize the error */
    if ((ref->fd = open(path, oflag)) != -1 && fstat(ref->fd, &ref->st) == 0) {
        ref->_last_modified.str[0] = '\0';
        ref->_etag.len = 0;
    } else {
        ref->open_err = errno;
        if (ref->fd != -1) {
            close(ref->fd);
            ref->fd = -1;
        }
    }

Exit:
    /* if the cache entry retains an error, return it instead of the reference */
    if (ref->fd == -1) {
        errno = ref->open_err;
        h2o_filecache_close_file(ref);
        ref = NULL;
    }
    return ref;
}